

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushMultiItemsWidths(int components,float w_full)

{
  ImVector<float> *this;
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  float w_item_last;
  float w_item_one;
  float local_30;
  float local_2c;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (w_full <= 0.0) {
    w_full = CalcItemWidth();
  }
  fVar6 = (pIVar2->Style).ItemInnerSpacing.x;
  iVar3 = components + -1;
  fVar7 = (float)(int)((w_full - fVar6 * (float)iVar3) / (float)components);
  local_2c = 1.0;
  if (1.0 <= fVar7) {
    local_2c = fVar7;
  }
  fVar6 = (float)(int)(w_full - (local_2c + fVar6) * (float)iVar3);
  local_30 = 1.0;
  if (1.0 <= fVar6) {
    local_30 = fVar6;
  }
  this = &(pIVar1->DC).ItemWidthStack;
  ImVector<float>::push_back(this,&local_30);
  iVar4 = 0;
  if (0 < iVar3) {
    iVar4 = iVar3;
  }
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    ImVector<float>::push_back(this,&local_2c);
  }
  (pIVar1->DC).ItemWidth =
       (pIVar1->DC).ItemWidthStack.Data[(long)(pIVar1->DC).ItemWidthStack.Size + -1];
  return;
}

Assistant:

void ImGui::PushMultiItemsWidths(int components, float w_full)
{
    ImGuiWindow* window = GetCurrentWindow();
    const ImGuiStyle& style = GImGui->Style;
    if (w_full <= 0.0f)
        w_full = CalcItemWidth();
    const float w_item_one  = ImMax(1.0f, (float)(int)((w_full - (style.ItemInnerSpacing.x) * (components-1)) / (float)components));
    const float w_item_last = ImMax(1.0f, (float)(int)(w_full - (w_item_one + style.ItemInnerSpacing.x) * (components-1)));
    window->DC.ItemWidthStack.push_back(w_item_last);
    for (int i = 0; i < components-1; i++)
        window->DC.ItemWidthStack.push_back(w_item_one);
    window->DC.ItemWidth = window->DC.ItemWidthStack.back();
}